

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

int __thiscall TURBOLINECOUNT::CLineCount::close(CLineCount *this,int __fd)

{
  int iVar1;
  int *piVar2;
  char *__s;
  int iVar3;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  allocator<char> local_61;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd);
  if (this->m_opened == false) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"file not opened","");
    this->m_lasterror = 9;
    std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    iVar3 = 0;
  }
  else {
    iVar1 = ::close(this->m_fh);
    iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar1 != -1);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      __s = strerror(iVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_61);
      this->m_lasterror = iVar1;
      ctx = (EVP_PKEY_CTX *)local_60;
      std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
      if (local_60[0] != local_50) {
        ctx = (EVP_PKEY_CTX *)(local_50[0] + 1);
        operator_delete(local_60[0],(ulong)ctx);
      }
    }
    init(this,ctx);
  }
  return iVar3;
}

Assistant:

bool CLineCount::close()
{
	if (!m_opened)
	{
		setLastError(EBADF, _T("file not opened"));
		return false;
	}

	bool ok = true;
	if (!LCCLOSEFILE(m_fh))
	{
		LCSETREALLASTERROR(EBADF, _T("unable to close file"));
		ok = false;
	}

	init();

	return ok;
}